

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_b4327e::X509Test_DirHashThreads_Test::TestBody
          (X509Test_DirHashThreads_Test *this)

{
  EVP_PKEY *pEVar1;
  undefined1 auVar2 [8];
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  EVP_MD *pEVar7;
  char *pcVar8;
  char *in_R9;
  pointer *__ptr;
  long lVar9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var10;
  AssertionResult gtest_ar__10;
  UniquePtr<X509> old_leaf1;
  UniquePtr<X509> old_leaf2;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  string old_ca1;
  string old_ca2;
  anon_class_8_1_a8a4e801 verify;
  UniquePtr<X509_STORE> store;
  string ca1;
  UniquePtr<X509> leaf1;
  anon_class_16_2_441bd9f7 add_crl;
  string ca2;
  UniquePtr<X509> leaf2;
  UniquePtr<EVP_PKEY> key;
  anon_class_8_1_ba1d59bf issue_cert;
  anon_class_16_2_441bd9f7 add_root;
  TemporaryHashDir dir;
  undefined1 local_208 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_200;
  UniquePtr<X509> local_1f8;
  undefined1 local_1f0 [8];
  undefined1 local_1e8 [8];
  undefined1 auStack_1e0 [8];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined1 local_188 [16];
  AssertHelper local_178;
  undefined1 local_170 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_150;
  anon_class_16_2_441bd9f7 local_148;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  NAME_CONSTRAINTS *local_128 [2];
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_110;
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Rb_tree_node_base local_b8;
  size_t local_98;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  local_90;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  local_60;
  
  bVar5 = bssl::SkipTempFileTests();
  if (bVar5) {
    testing::Message::Message((Message *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_170,kSkip,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x20ad,"");
    testing::internal::AssertHelper::operator=((AssertHelper *)local_170,(Message *)local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_170);
    if ((long *)CONCAT44(local_e8._4_4_,local_e8._0_4_) == (long *)0x0) {
      return;
    }
    (**(code **)(*(long *)CONCAT44(local_e8._4_4_,local_e8._0_4_) + 8))();
    return;
  }
  PrivateKeyFromPEM((anon_unknown_dwarf_b4327e *)&local_110,
                    "\n-----BEGIN PRIVATE KEY-----\nMIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQgBw8IcnrUoEqc3VnJ\nTYlodwi1b8ldMHcO6NHJzgqLtGqhRANCAATmK2niv2Wfl74vHg2UikzVl2u3qR4N\nRvvdqakendy6WgHn1peoChj5w8SjHlbifINI2xYaHPUdfvGULUvPciLB\n-----END PRIVATE KEY-----\n"
                   );
  local_170[0] = (EVP_PKEY *)local_110._M_head_impl != (EVP_PKEY *)0x0;
  local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((EVP_PKEY *)local_110._M_head_impl == (EVP_PKEY *)0x0) {
    testing::Message::Message((Message *)&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e8,(internal *)local_170,(AssertionResult *)0x607821,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x20b1,(char *)CONCAT44(local_e8._4_4_,local_e8._0_4_));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1c8,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1c8);
    if ((undefined1 *)CONCAT44(local_e8._4_4_,local_e8._0_4_) != local_e8 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_e8._4_4_,local_e8._0_4_),local_e8._16_8_ + 1);
    }
    if (local_138._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)(*(NAME_CONSTRAINTS **)local_138._M_head_impl)->excludedSubtrees)();
    }
    if (local_168 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_170 + 8),local_168);
    }
    goto LAB_0041fc31;
  }
  local_e8._0_4_ = 1;
  local_e8._8_8_ = &local_d0;
  local_e8._16_8_ = 0;
  local_d0._M_local_buf[0] = '\0';
  local_b8._M_left = &local_b8;
  local_b8._M_color = _S_red;
  local_b8._M_parent = (_Base_ptr)0x0;
  local_98 = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8._M_right = local_b8._M_left;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar5 = bssl::TemporaryDirectory::Init((TemporaryDirectory *)(local_e8 + 8));
  local_138._M_head_impl._0_1_ = bVar5;
  local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar5) {
LAB_0041e343:
    local_148.dir = (TemporaryHashDir *)local_e8;
    local_170 = (undefined1  [8])&local_160;
    local_148.key = (UniquePtr<EVP_PKEY> *)&local_110;
    local_108._0_8_ = (anon_unknown_dwarf_b4327e *)&local_110;
    local_108._8_8_ = (anon_unknown_dwarf_b4327e *)&local_110;
    local_f8._M_allocated_capacity = (size_type)local_148.dir;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"Test CA 1191514847","");
    local_138._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"Test CA 1570301806","");
    MakeTestCert((anon_unknown_dwarf_b4327e *)local_1c8,(char *)local_170,(char *)local_170,
                 local_110._M_head_impl,true);
    uVar3 = local_1c8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
LAB_0041e504:
      bVar5 = false;
    }
    else {
      pEVar7 = EVP_sha256();
      iVar6 = X509_sign((X509 *)uVar3,(EVP_PKEY *)local_110._M_head_impl,pEVar7);
      if (iVar6 == 0) goto LAB_0041e504;
      bVar5 = TemporaryHashDir::AddCert
                        ((TemporaryHashDir *)local_e8,(X509 *)local_1c8._0_8_,kNewHash);
    }
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_1c8);
    uVar3 = local_108._8_8_;
    local_1a8[0] = bVar5;
    local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar5 == false) {
      testing::Message::Message((Message *)local_1e8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1c8,(internal *)local_1a8,
                 (AssertionResult *)"add_root(ca1, kNewHash)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_208,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x20d6,(char *)local_1c8._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_208,(Message *)local_1e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._0_8_ != &local_1b8) {
        operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
      }
      if (local_1e8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_1e8 + 8))();
      }
      if (local_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1a0,local_1a0);
      }
    }
    else {
      local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      MakeTestCert((anon_unknown_dwarf_b4327e *)local_1c8,(char *)local_138._M_head_impl,
                   (char *)local_138._M_head_impl,*(EVP_PKEY **)local_108._8_8_,true);
      uVar4 = local_1c8._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
LAB_0041e638:
        bVar5 = false;
      }
      else {
        pEVar1 = *(EVP_PKEY **)uVar3;
        pEVar7 = EVP_sha256();
        iVar6 = X509_sign((X509 *)uVar4,pEVar1,pEVar7);
        if (iVar6 == 0) goto LAB_0041e638;
        bVar5 = TemporaryHashDir::AddCert
                          ((TemporaryHashDir *)local_f8._M_allocated_capacity,
                           (X509 *)local_1c8._0_8_,kNewHash);
      }
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_1c8);
      local_1a8[0] = bVar5;
      local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar5 == false) {
        testing::Message::Message((Message *)local_1e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1c8,(internal *)local_1a8,
                   (AssertionResult *)"add_root(ca2, kNewHash)","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_208,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x20d7,(char *)local_1c8._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_208,(Message *)local_1e8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_208);
        if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_1c8._0_8_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b8) {
          operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
        }
        if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )local_1e8 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_1e8 + 8))();
        }
        if (local_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1a0,local_1a0);
        }
      }
      else {
        local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        MakeTestCRL((anon_unknown_dwarf_b4327e *)local_1c8,(char *)local_170,-2,1);
        uVar3 = local_1c8._0_8_;
        if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )local_1c8._0_8_ ==
            (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
LAB_0041e76a:
          bVar5 = false;
        }
        else {
          pEVar1 = *(EVP_PKEY **)local_148.key;
          pEVar7 = EVP_sha256();
          iVar6 = X509_CRL_sign((X509_CRL *)uVar3,pEVar1,pEVar7);
          if (iVar6 == 0) goto LAB_0041e76a;
          bVar5 = TemporaryHashDir::AddCRL(local_148.dir,(X509_CRL *)local_1c8._0_8_,kNewHash);
        }
        std::unique_ptr<X509_crl_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<X509_crl_st,_bssl::internal::Deleter> *)local_1c8);
        local_1a8[0] = bVar5;
        local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar5 == false) {
          testing::Message::Message((Message *)local_1e8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_1c8,(internal *)local_1a8,
                     (AssertionResult *)"add_crl(ca1, -2, kNewHash)","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_208,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x20d8,(char *)local_1c8._0_8_);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_208,(Message *)local_1e8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_208);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._0_8_ != &local_1b8) {
            operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
          }
          if (local_1e8 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_1e8 + 8))();
          }
          if (local_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_1a0,local_1a0);
          }
        }
        else {
          local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          MakeTestCRL((anon_unknown_dwarf_b4327e *)local_1c8,(char *)local_138._M_head_impl,-1,1);
          uVar3 = local_1c8._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._0_8_ ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
LAB_0041e89c:
            bVar5 = false;
          }
          else {
            pEVar1 = *(EVP_PKEY **)local_148.key;
            pEVar7 = EVP_sha256();
            iVar6 = X509_CRL_sign((X509_CRL *)uVar3,pEVar1,pEVar7);
            if (iVar6 == 0) goto LAB_0041e89c;
            bVar5 = TemporaryHashDir::AddCRL(local_148.dir,(X509_CRL *)local_1c8._0_8_,kNewHash);
          }
          std::unique_ptr<X509_crl_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<X509_crl_st,_bssl::internal::Deleter> *)local_1c8);
          local_1a8[0] = bVar5;
          local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (bVar5 == false) {
            testing::Message::Message((Message *)local_1e8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_1c8,(internal *)local_1a8,
                       (AssertionResult *)"add_crl(ca2, -1, kNewHash)","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_208,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0x20d9,(char *)local_1c8._0_8_);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_208,(Message *)local_1e8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_208);
            if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_1c8._0_8_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &local_1b8) {
              operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
            }
            if (local_1e8 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)local_1e8 + 8))();
            }
            if (local_1a0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_1a0,local_1a0);
            }
          }
          else {
            local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            MakeTestCRL((anon_unknown_dwarf_b4327e *)local_1c8,(char *)local_138._M_head_impl,-2,1);
            uVar3 = local_1c8._0_8_;
            if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )local_1c8._0_8_ ==
                (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
LAB_0041e9ce:
              bVar5 = false;
            }
            else {
              pEVar1 = *(EVP_PKEY **)local_148.key;
              pEVar7 = EVP_sha256();
              iVar6 = X509_CRL_sign((X509_CRL *)uVar3,pEVar1,pEVar7);
              if (iVar6 == 0) goto LAB_0041e9ce;
              bVar5 = TemporaryHashDir::AddCRL(local_148.dir,(X509_CRL *)local_1c8._0_8_,kNewHash);
            }
            std::unique_ptr<X509_crl_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<X509_crl_st,_bssl::internal::Deleter> *)local_1c8);
            local_1a8[0] = bVar5;
            local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (bVar5 == false) {
              testing::Message::Message((Message *)local_1e8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_1c8,(internal *)local_1a8,
                         (AssertionResult *)"add_crl(ca2, -2, kNewHash)","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_208,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0x20da,(char *)local_1c8._0_8_);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_208,(Message *)local_1e8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_208);
              if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_1c8._0_8_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &local_1b8) {
                operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
              }
              if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )local_1e8 !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_1e8 + 8))();
              }
              if (local_1a0 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_1a0,local_1a0);
              }
            }
            else {
              local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              MakeTestCRL((anon_unknown_dwarf_b4327e *)local_1c8,(char *)local_170,-1,1);
              uVar3 = local_1c8._0_8_;
              if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                   )local_1c8._0_8_ ==
                  (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
LAB_0041eb00:
                bVar5 = false;
              }
              else {
                pEVar1 = *(EVP_PKEY **)local_148.key;
                pEVar7 = EVP_sha256();
                iVar6 = X509_CRL_sign((X509_CRL *)uVar3,pEVar1,pEVar7);
                if (iVar6 == 0) goto LAB_0041eb00;
                bVar5 = TemporaryHashDir::AddCRL(local_148.dir,(X509_CRL *)local_1c8._0_8_,kNewHash)
                ;
              }
              std::unique_ptr<X509_crl_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<X509_crl_st,_bssl::internal::Deleter> *)local_1c8);
              local_1a8[0] = bVar5;
              local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (bVar5 == false) {
                testing::Message::Message((Message *)local_1e8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_1c8,(internal *)local_1a8,
                           (AssertionResult *)"add_crl(ca1, -1, kNewHash)","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)local_208,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0x20db,(char *)local_1c8._0_8_);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)local_208,(Message *)local_1e8);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_208);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c8._0_8_ != &local_1b8) {
                  operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
                }
                if (local_1e8 != (undefined1  [8])0x0) {
                  (**(code **)(*(long *)local_1e8 + 8))();
                }
                if (local_1a0 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_1a0,local_1a0);
                }
              }
              else {
                local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                ;
                local_1a8 = (undefined1  [8])local_90._M_impl.super__Rb_tree_header._M_node_count;
                local_1e8._0_4_ = 1;
                testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                          ((internal *)local_1c8,"dir.num_cert_hashes()","1u",
                           (unsigned_long *)local_1a8,(uint *)local_1e8);
                if ((anon_unknown_dwarf_b4327e)local_1c8[0] == (anon_unknown_dwarf_b4327e)0x0) {
                  testing::Message::Message((Message *)local_1a8);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_1c8._8_8_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar8 = "";
                  }
                  else {
                    pcVar8 = *(char **)local_1c8._8_8_;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)local_1e8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x20dd,pcVar8);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)local_1e8,(Message *)local_1a8);
                }
                else {
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_1c8._8_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)(local_1c8 + 8),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1c8._8_8_);
                  }
                  local_1a8 = (undefined1  [8])local_60._M_impl.super__Rb_tree_header._M_node_count;
                  local_1e8._0_4_ = 1;
                  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                            ((internal *)local_1c8,"dir.num_crl_hashes()","1u",
                             (unsigned_long *)local_1a8,(uint *)local_1e8);
                  if ((anon_unknown_dwarf_b4327e)local_1c8[0] != (anon_unknown_dwarf_b4327e)0x0) {
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_1c8._8_8_ !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)(local_1c8 + 8),
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_1c8._8_8_);
                    }
                    uVar4 = local_108._0_8_;
                    MakeTestCert((anon_unknown_dwarf_b4327e *)local_1c8,(char *)local_170,"Leaf",
                                 *(EVP_PKEY **)local_108._0_8_,false);
                    uVar3 = local_1c8._0_8_;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c8._0_8_ ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) {
LAB_0041ed51:
                      local_150._M_head_impl =
                           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                            *)0x0;
                    }
                    else {
                      pEVar1 = *(EVP_PKEY **)uVar4;
                      pEVar7 = EVP_sha256();
                      iVar6 = X509_sign((X509 *)uVar3,pEVar1,pEVar7);
                      if (iVar6 == 0) goto LAB_0041ed51;
                      local_150._M_head_impl =
                           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                            *)local_1c8._0_8_;
                      local_1c8._0_8_ =
                           (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            )0x0;
                    }
                    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_1c8);
                    local_1a8[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                    *)local_150._M_head_impl !=
                                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                    *)0x0;
                    local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_150._M_head_impl ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) {
                      testing::Message::Message((Message *)local_1e8);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)local_1c8,(internal *)local_1a8,
                                 (AssertionResult *)0x5afe0f,"false","true",in_R9);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)local_208,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                 ,0x20e0,(char *)local_1c8._0_8_);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)local_208,(Message *)local_1e8);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_208);
                      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )local_1c8._0_8_ !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )&local_1b8) {
                        operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1)
                        ;
                      }
                      if (local_1e8 != (undefined1  [8])0x0) {
                        (**(code **)(*(long *)local_1e8 + 8))();
                      }
                      if (local_1a0 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&local_1a0,local_1a0);
                      }
                    }
                    else {
                      MakeTestCert((anon_unknown_dwarf_b4327e *)local_1c8,
                                   (char *)local_138._M_head_impl,"Leaf",*(EVP_PKEY **)uVar4,false);
                      uVar3 = local_1c8._0_8_;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1c8._0_8_ ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0) {
LAB_0041ede1:
                        local_118._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl =
                             (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )(_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )0x0;
                      }
                      else {
                        pEVar1 = *(EVP_PKEY **)uVar4;
                        pEVar7 = EVP_sha256();
                        iVar6 = X509_sign((X509 *)uVar3,pEVar1,pEVar7);
                        if (iVar6 == 0) goto LAB_0041ede1;
                        local_118._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl =
                             (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )local_1c8._0_8_;
                        local_1c8._0_8_ =
                             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                              *)0x0;
                      }
                      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_1c8);
                      local_1a8[0] = local_118._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl !=
                                     (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )0x0;
                      local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0;
                      if (local_118._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl ==
                          (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )0x0) {
                        testing::Message::Message((Message *)local_1e8);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_1c8,(internal *)local_1a8,
                                   (AssertionResult *)0x5afe19,"false","true",in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)local_208,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                   ,0x20e2,(char *)local_1c8._0_8_);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)local_208,(Message *)local_1e8);
                        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_208);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1c8._0_8_ != &local_1b8) {
                          operator_delete((void *)local_1c8._0_8_,
                                          local_1b8._M_allocated_capacity + 1);
                        }
                        if (local_1e8 != (undefined1  [8])0x0) {
                          (**(code **)(*(long *)local_1e8 + 8))();
                        }
                        if (local_1a0 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           ) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&local_1a0,local_1a0);
                        }
                      }
                      else {
                        local_1c8._0_8_ = &local_1b8;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_1c8,"Test CA 1069881739","");
                        local_1a8 = (undefined1  [8])&local_198;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_1a8,"Test CA 940754110","");
                        bVar5 = TestBody::anon_class_16_2_441bd9f7::operator()
                                          ((anon_class_16_2_441bd9f7 *)(local_108 + 8),
                                           (string *)local_1c8,kOldHash);
                        local_208[0] = bVar5;
                        local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0;
                        if (bVar5) {
LAB_0041ef30:
                          bVar5 = TestBody::anon_class_16_2_441bd9f7::operator()
                                            ((anon_class_16_2_441bd9f7 *)(local_108 + 8),
                                             (string *)local_1a8,kOldHash);
                          local_208[0] = bVar5;
                          local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0;
                          if (!bVar5) {
                            testing::Message::Message((Message *)&local_1f8);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_1e8,(internal *)local_208,
                                       (AssertionResult *)"add_root(old_ca2, kOldHash)","false",
                                       "true",in_R9);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)local_1f0,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                       ,0x20e8,(char *)local_1e8);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)local_1f0,(Message *)&local_1f8);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)local_1f0);
                            if (local_1e8 != (undefined1  [8])local_1d8) {
                              operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
                            }
                            if ((long *)CONCAT44(local_1f8._M_t.
                                                 super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                 .super__Head_base<0UL,_x509_st_*,_false>.
                                                 _M_head_impl._4_4_,
                                                 local_1f8._M_t.
                                                 super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                 .super__Head_base<0UL,_x509_st_*,_false>.
                                                 _M_head_impl._0_4_) != (long *)0x0) {
                              (**(code **)(*(long *)CONCAT44(local_1f8._M_t.
                                                                                                                          
                                                  super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_x509_st_*,_false>.
                                                  _M_head_impl._4_4_,
                                                  local_1f8._M_t.
                                                  super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_x509_st_*,_false>.
                                                  _M_head_impl._0_4_) + 8))();
                            }
                            if (local_200 !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&local_200,local_200);
                            }
                            if (!bVar5) goto LAB_0041fb88;
                          }
                          bVar5 = TestBody::anon_class_16_2_441bd9f7::operator()
                                            (&local_148,(string *)local_1c8,-2,kOldHash);
                          local_208[0] = bVar5;
                          local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0;
                          if (!bVar5) {
                            testing::Message::Message((Message *)&local_1f8);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_1e8,(internal *)local_208,
                                       (AssertionResult *)"add_crl(old_ca1, -2, kOldHash)","false",
                                       "true",in_R9);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)local_1f0,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                       ,0x20e9,(char *)local_1e8);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)local_1f0,(Message *)&local_1f8);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)local_1f0);
                            if (local_1e8 != (undefined1  [8])local_1d8) {
                              operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
                            }
                            if ((long *)CONCAT44(local_1f8._M_t.
                                                 super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                 .super__Head_base<0UL,_x509_st_*,_false>.
                                                 _M_head_impl._4_4_,
                                                 local_1f8._M_t.
                                                 super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                 .super__Head_base<0UL,_x509_st_*,_false>.
                                                 _M_head_impl._0_4_) != (long *)0x0) {
                              (**(code **)(*(long *)CONCAT44(local_1f8._M_t.
                                                                                                                          
                                                  super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_x509_st_*,_false>.
                                                  _M_head_impl._4_4_,
                                                  local_1f8._M_t.
                                                  super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_x509_st_*,_false>.
                                                  _M_head_impl._0_4_) + 8))();
                            }
                            if (local_200 !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&local_200,local_200);
                            }
                            if (!bVar5) goto LAB_0041fb88;
                          }
                          bVar5 = TestBody::anon_class_16_2_441bd9f7::operator()
                                            (&local_148,(string *)local_1a8,-1,kOldHash);
                          local_208[0] = bVar5;
                          local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0;
                          if (!bVar5) {
                            testing::Message::Message((Message *)&local_1f8);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_1e8,(internal *)local_208,
                                       (AssertionResult *)"add_crl(old_ca2, -1, kOldHash)","false",
                                       "true",in_R9);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)local_1f0,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                       ,0x20ea,(char *)local_1e8);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)local_1f0,(Message *)&local_1f8);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)local_1f0);
                            if (local_1e8 != (undefined1  [8])local_1d8) {
                              operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
                            }
                            if ((long *)CONCAT44(local_1f8._M_t.
                                                 super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                 .super__Head_base<0UL,_x509_st_*,_false>.
                                                 _M_head_impl._4_4_,
                                                 local_1f8._M_t.
                                                 super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                 .super__Head_base<0UL,_x509_st_*,_false>.
                                                 _M_head_impl._0_4_) != (long *)0x0) {
                              (**(code **)(*(long *)CONCAT44(local_1f8._M_t.
                                                                                                                          
                                                  super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_x509_st_*,_false>.
                                                  _M_head_impl._4_4_,
                                                  local_1f8._M_t.
                                                  super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_x509_st_*,_false>.
                                                  _M_head_impl._0_4_) + 8))();
                            }
                            if (local_200 !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&local_200,local_200);
                            }
                            if (!bVar5) goto LAB_0041fb88;
                          }
                          bVar5 = TestBody::anon_class_16_2_441bd9f7::operator()
                                            (&local_148,(string *)local_1a8,-2,kOldHash);
                          local_208[0] = bVar5;
                          local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0;
                          if (!bVar5) {
                            testing::Message::Message((Message *)&local_1f8);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_1e8,(internal *)local_208,
                                       (AssertionResult *)"add_crl(old_ca2, -2, kOldHash)","false",
                                       "true",in_R9);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)local_1f0,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                       ,0x20eb,(char *)local_1e8);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)local_1f0,(Message *)&local_1f8);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)local_1f0);
                            if (local_1e8 != (undefined1  [8])local_1d8) {
                              operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
                            }
                            if ((long *)CONCAT44(local_1f8._M_t.
                                                 super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                 .super__Head_base<0UL,_x509_st_*,_false>.
                                                 _M_head_impl._4_4_,
                                                 local_1f8._M_t.
                                                 super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                 .super__Head_base<0UL,_x509_st_*,_false>.
                                                 _M_head_impl._0_4_) != (long *)0x0) {
                              (**(code **)(*(long *)CONCAT44(local_1f8._M_t.
                                                                                                                          
                                                  super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_x509_st_*,_false>.
                                                  _M_head_impl._4_4_,
                                                  local_1f8._M_t.
                                                  super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_x509_st_*,_false>.
                                                  _M_head_impl._0_4_) + 8))();
                            }
                            if (local_200 !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&local_200,local_200);
                            }
                            if (!bVar5) goto LAB_0041fb88;
                          }
                          bVar5 = TestBody::anon_class_16_2_441bd9f7::operator()
                                            (&local_148,(string *)local_1c8,-1,kOldHash);
                          local_208[0] = bVar5;
                          local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0;
                          if (!bVar5) {
                            testing::Message::Message((Message *)&local_1f8);
                            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                      ((string *)local_1e8,(internal *)local_208,
                                       (AssertionResult *)"add_crl(old_ca1, -1, kOldHash)","false",
                                       "true",in_R9);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)local_1f0,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                       ,0x20ec,(char *)local_1e8);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)local_1f0,(Message *)&local_1f8);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)local_1f0);
                            if (local_1e8 != (undefined1  [8])local_1d8) {
                              operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
                            }
                            if ((long *)CONCAT44(local_1f8._M_t.
                                                 super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                 .super__Head_base<0UL,_x509_st_*,_false>.
                                                 _M_head_impl._4_4_,
                                                 local_1f8._M_t.
                                                 super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                 .super__Head_base<0UL,_x509_st_*,_false>.
                                                 _M_head_impl._0_4_) != (long *)0x0) {
                              (**(code **)(*(long *)CONCAT44(local_1f8._M_t.
                                                                                                                          
                                                  super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_x509_st_*,_false>.
                                                  _M_head_impl._4_4_,
                                                  local_1f8._M_t.
                                                  super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_x509_st_*,_false>.
                                                  _M_head_impl._0_4_) + 8))();
                            }
                            if (local_200 !=
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&local_200,local_200);
                            }
                            if (!bVar5) goto LAB_0041fb88;
                          }
                          local_208 = (undefined1  [8])
                                      local_90._M_impl.super__Rb_tree_header._M_node_count;
                          local_1f8._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                          _M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_4_ = 2;
                          testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                                    ((internal *)local_1e8,"dir.num_cert_hashes()","2u",
                                     (unsigned_long *)local_208,(uint *)&local_1f8);
                          if (local_1e8[0] == (internal)0x0) {
                            testing::Message::Message((Message *)local_208);
                            if (auStack_1e0 == (undefined1  [8])0x0) {
                              pcVar8 = "";
                            }
                            else {
                              pcVar8 = *(char **)auStack_1e0;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&local_1f8,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                       ,0x20ee,pcVar8);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&local_1f8,(Message *)local_208);
                          }
                          else {
                            if (auStack_1e0 != (undefined1  [8])0x0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)auStack_1e0,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)auStack_1e0);
                            }
                            local_208 = (undefined1  [8])
                                        local_60._M_impl.super__Rb_tree_header._M_node_count;
                            local_1f8._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                            _M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl._0_4_ = 2;
                            testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                                      ((internal *)local_1e8,"dir.num_crl_hashes()","2u",
                                       (unsigned_long *)local_208,(uint *)&local_1f8);
                            if (local_1e8[0] != (internal)0x0) {
                              if (auStack_1e0 != (undefined1  [8])0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)auStack_1e0,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)auStack_1e0);
                              }
                              TestBody::anon_class_8_1_ba1d59bf::operator()
                                        ((anon_class_8_1_ba1d59bf *)&local_1f8,(string *)local_108);
                              bVar5 = CONCAT44(local_1f8._M_t.
                                               super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                               .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl
                                               ._4_4_,local_1f8._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_x509_st_*,_false>.
                                                  _M_head_impl._0_4_) == 0;
                              local_208[0] = !bVar5;
                              local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)0x0;
                              if (bVar5) {
                                testing::Message::Message((Message *)local_1f0);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)local_1e8,(internal *)local_208,
                                           (AssertionResult *)"old_leaf1","false","true",in_R9);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)(local_188 + 8),kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                           ,0x20f1,(char *)local_1e8);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)(local_188 + 8),(Message *)local_1f0);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)(local_188 + 8));
                                if (local_1e8 != (undefined1  [8])local_1d8) {
                                  operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
                                }
                                if (local_1f0 != (undefined1  [8])0x0) {
                                  (**(code **)(*(long *)local_1f0 + 8))();
                                }
                                if (local_200 !=
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&local_200,local_200);
                                }
                              }
                              else {
                                TestBody::anon_class_8_1_ba1d59bf::operator()
                                          ((anon_class_8_1_ba1d59bf *)local_1f0,(string *)local_108)
                                ;
                                local_208[0] = local_1f0 != (undefined1  [8])0x0;
                                local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)0x0;
                                if (local_1f0 == (undefined1  [8])0x0) {
                                  testing::Message::Message((Message *)(local_188 + 8));
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)local_1e8,(internal *)local_208,
                                             (AssertionResult *)"old_leaf2","false","true",in_R9);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)local_188,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                             ,0x20f3,(char *)local_1e8);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)local_188,(Message *)(local_188 + 8));
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)local_188);
                                  if (local_1e8 != (undefined1  [8])local_1d8) {
                                    operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
                                  }
                                  if ((X509_STORE *)local_188._8_8_ != (X509_STORE *)0x0) {
                                    (**(code **)(*(long *)local_188._8_8_ + 8))();
                                  }
                                  if (local_200 !=
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)0x0) {
                                    std::
                                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_200,local_200);
                                  }
                                }
                                else {
                                  local_188._8_8_ = X509_STORE_new();
                                  local_208[0] = (X509_STORE *)local_188._8_8_ != (X509_STORE *)0x0;
                                  local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)0x0;
                                  if ((X509_STORE *)local_188._8_8_ == (X509_STORE *)0x0) {
                                    testing::Message::Message((Message *)local_188);
                                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                              ((string *)local_1e8,(internal *)local_208,
                                               (AssertionResult *)0x54e840,"false","true",in_R9);
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_178,kFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                               ,0x20f7,(char *)local_1e8);
                                    testing::internal::AssertHelper::operator=
                                              (&local_178,(Message *)local_188);
LAB_0041fb05:
                                    testing::internal::AssertHelper::~AssertHelper(&local_178);
                                    if (local_1e8 != (undefined1  [8])local_1d8) {
                                      operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
                                    }
                                    if ((long *)local_188._0_8_ != (long *)0x0) {
                                      (**(code **)(*(long *)local_188._0_8_ + 8))();
                                    }
                                    if (local_200 !=
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&local_200,local_200);
                                    }
                                  }
                                  else {
                                    iVar6 = X509_STORE_load_locations
                                                      ((X509_STORE *)local_188._8_8_,(char *)0x0,
                                                       (char *)local_e8._8_8_);
                                    local_208[0] = iVar6 != 0;
                                    local_200 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)0x0;
                                    if (iVar6 == 0) {
                                      testing::Message::Message((Message *)local_188);
                                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                ((string *)local_1e8,(internal *)local_208,
                                                 (AssertionResult *)
                                                 "X509_STORE_load_locations(store.get(), nullptr, dir.path().c_str())"
                                                 ,"false","true",in_R9);
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_178,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                                 ,0x20f9,(char *)local_1e8);
                                      testing::internal::AssertHelper::operator=
                                                (&local_178,(Message *)local_188);
                                      goto LAB_0041fb05;
                                    }
                                    local_188._0_8_ = local_188 + 8;
                                    local_1e8 = (undefined1  [8])0x0;
                                    auStack_1e0 = (undefined1  [8])0x0;
                                    local_1d8._0_8_ = 0;
                                    lVar9 = 10;
                                    do {
                                      local_208 = (undefined1  [8])local_188;
                                      local_200 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_150;
                                      std::vector<std::thread,std::allocator<std::thread>>::
                                      emplace_back<(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__0>
                                                ((vector<std::thread,std::allocator<std::thread>> *)
                                                 local_1e8,
                                                 (anon_class_16_2_e7b7d2c5_for__M_head_impl *)
                                                 local_208);
                                      local_208 = (undefined1  [8])local_188;
                                      local_200 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_150;
                                      std::vector<std::thread,std::allocator<std::thread>>::
                                      emplace_back<(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__1>
                                                ((vector<std::thread,std::allocator<std::thread>> *)
                                                 local_1e8,
                                                 (anon_class_16_2_e7b7d2c5_for__M_head_impl *)
                                                 local_208);
                                      local_208 = (undefined1  [8])local_188;
                                      local_200 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_118;
                                      std::vector<std::thread,std::allocator<std::thread>>::
                                      emplace_back<(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__2>
                                                ((vector<std::thread,std::allocator<std::thread>> *)
                                                 local_1e8,
                                                 (anon_class_16_2_e7b7d2c6_for__M_head_impl *)
                                                 local_208);
                                      local_208 = (undefined1  [8])local_188;
                                      local_200 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_118;
                                      local_f8._8_8_ = lVar9;
                                      std::vector<std::thread,std::allocator<std::thread>>::
                                      emplace_back<(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__3>
                                                ((vector<std::thread,std::allocator<std::thread>> *)
                                                 local_1e8,
                                                 (anon_class_16_2_e7b7d2c6_for__M_head_impl *)
                                                 local_208);
                                      local_208 = (undefined1  [8])local_188;
                                      local_200 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_1f8;
                                      std::vector<std::thread,std::allocator<std::thread>>::
                                      emplace_back<(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__4>
                                                ((vector<std::thread,std::allocator<std::thread>> *)
                                                 local_1e8,
                                                 (anon_class_16_2_c3e0be2d_for__M_head_impl *)
                                                 local_208);
                                      local_208 = (undefined1  [8])local_188;
                                      local_200 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_1f8;
                                      std::vector<std::thread,std::allocator<std::thread>>::
                                      emplace_back<(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__5>
                                                ((vector<std::thread,std::allocator<std::thread>> *)
                                                 local_1e8,
                                                 (anon_class_16_2_c3e0be2d_for__M_head_impl *)
                                                 local_208);
                                      local_208 = (undefined1  [8])local_188;
                                      local_200 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1f0;
                                      std::vector<std::thread,std::allocator<std::thread>>::
                                      emplace_back<(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__6>
                                                ((vector<std::thread,std::allocator<std::thread>> *)
                                                 local_1e8,
                                                 (anon_class_16_2_c3e0be2e_for__M_head_impl *)
                                                 local_208);
                                      local_208 = (undefined1  [8])local_188;
                                      local_200 = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1f0;
                                      std::vector<std::thread,std::allocator<std::thread>>::
                                      emplace_back<(anonymous_namespace)::X509Test_DirHashThreads_Test::TestBody()::__7>
                                                ((vector<std::thread,std::allocator<std::thread>> *)
                                                 local_1e8,
                                                 (anon_class_16_2_c3e0be2e_for__M_head_impl *)
                                                 local_208);
                                      auVar2 = auStack_1e0;
                                      lVar9 = local_f8._8_8_ + -1;
                                      _Var10._M_head_impl =
                                           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_1e8;
                                    } while (lVar9 != 0);
                                    for (; (undefined1  [8])_Var10._M_head_impl != auVar2;
                                        _Var10._M_head_impl = _Var10._M_head_impl + 8) {
                                      std::thread::join();
                                    }
                                    std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                                              ((vector<std::thread,_std::allocator<std::thread>_> *)
                                               local_1e8);
                                  }
                                  std::unique_ptr<x509_store_st,_bssl::internal::Deleter>::
                                  ~unique_ptr((unique_ptr<x509_store_st,_bssl::internal::Deleter> *)
                                              (local_188 + 8));
                                }
                                std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                                          ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_1f0
                                          );
                              }
                              std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                                        (&local_1f8);
                              goto LAB_0041fb88;
                            }
                            testing::Message::Message((Message *)local_208);
                            if (auStack_1e0 == (undefined1  [8])0x0) {
                              pcVar8 = "";
                            }
                            else {
                              pcVar8 = *(char **)auStack_1e0;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&local_1f8,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                       ,0x20ef,pcVar8);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&local_1f8,(Message *)local_208);
                          }
                          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f8)
                          ;
                          if (local_208 != (undefined1  [8])0x0) {
                            (**(code **)(*(size_type *)local_208 + 8))();
                          }
                          if (auStack_1e0 != (undefined1  [8])0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)auStack_1e0,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)auStack_1e0);
                          }
                        }
                        else {
                          testing::Message::Message((Message *)&local_1f8);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)local_1e8,(internal *)local_208,
                                     (AssertionResult *)"add_root(old_ca1, kOldHash)","false","true"
                                     ,in_R9);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)local_1f0,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                                     ,0x20e7,(char *)local_1e8);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)local_1f0,(Message *)&local_1f8);
                          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1f0);
                          if (local_1e8 != (undefined1  [8])local_1d8) {
                            operator_delete((void *)local_1e8,local_1d8._0_8_ + 1);
                          }
                          if ((long *)CONCAT44(local_1f8._M_t.
                                               super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                               .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl
                                               ._4_4_,local_1f8._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_x509_st_*,_false>.
                                                  _M_head_impl._0_4_) != (long *)0x0) {
                            (**(code **)(*(long *)CONCAT44(local_1f8._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_x509_st_*,_false>.
                                                  _M_head_impl._4_4_,
                                                  local_1f8._M_t.
                                                  super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_x509_st_*,_false>.
                                                  _M_head_impl._0_4_) + 8))();
                          }
                          if (local_200 !=
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&local_200,local_200);
                          }
                          if (bVar5) goto LAB_0041ef30;
                        }
LAB_0041fb88:
                        if (local_1a8 != (undefined1  [8])&local_198) {
                          operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1c8._0_8_ != &local_1b8) {
                          operator_delete((void *)local_1c8._0_8_,
                                          local_1b8._M_allocated_capacity + 1);
                        }
                      }
                      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_118);
                    }
                    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_150);
                    goto LAB_0041fbd5;
                  }
                  testing::Message::Message((Message *)local_1a8);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_1c8._8_8_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar8 = "";
                  }
                  else {
                    pcVar8 = *(char **)local_1c8._8_8_;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)local_1e8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                             ,0x20de,pcVar8);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)local_1e8,(Message *)local_1a8);
                }
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1e8);
                if (local_1a8 != (undefined1  [8])0x0) {
                  (**(code **)(*(size_type *)local_1a8 + 8))();
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_1c8._8_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)(local_1c8 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1c8._8_8_);
                }
              }
            }
          }
        }
      }
    }
LAB_0041fbd5:
    if (local_138._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128) {
      operator_delete(local_138._M_head_impl,(ulong)((long)&local_128[0]->permittedSubtrees + 1));
    }
    if (local_170 != (undefined1  [8])&local_160) {
      operator_delete((void *)local_170,local_160._M_allocated_capacity + 1);
    }
  }
  else {
    testing::Message::Message((Message *)local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_170,(internal *)&local_138,(AssertionResult *)"dir.Init()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x20b7,(char *)local_170);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1a8,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1a8);
    if (local_170 != (undefined1  [8])&local_160) {
      operator_delete((void *)local_170,local_160._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_1c8._0_8_ + 8))();
    }
    if (local_130 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_130,local_130);
    }
    if (bVar5) goto LAB_0041e343;
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  ::~_Rb_tree(&local_90);
  bssl::TemporaryDirectory::~TemporaryDirectory((TemporaryDirectory *)(local_e8 + 8));
LAB_0041fc31:
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_110);
  return;
}

Assistant:

TEST(X509Test, DirHashThreads) {
  if (bssl::SkipTempFileTests()) {
    GTEST_SKIP();
  }

  bssl::UniquePtr<EVP_PKEY> key = PrivateKeyFromPEM(kP256Key);
  ASSERT_TRUE(key);

  // Generate some roots and fill a directory with OpenSSL's directory hash
  // format. The hash depends only on the name, so we do not need to
  // pre-generate the certificates. Test both DER and PEM.
  TemporaryHashDir dir(X509_FILETYPE_PEM);
  ASSERT_TRUE(dir.Init());

  auto add_root = [&](const std::string &name, NameHash name_hash) -> bool {
    bssl::UniquePtr<X509> ca =
        MakeTestCert(name.c_str(), name.c_str(), key.get(), /*is_ca=*/true);
    return ca != nullptr &&  //
           X509_sign(ca.get(), key.get(), EVP_sha256()) &&
           dir.AddCert(ca.get(), name_hash);
  };

  auto issue_cert = [&](const std::string &issuer) -> bssl::UniquePtr<X509> {
    bssl::UniquePtr<X509> cert =
        MakeTestCert(issuer.c_str(), "Leaf", key.get(), /*is_ca=*/false);
    if (cert == nullptr || !X509_sign(cert.get(), key.get(), EVP_sha256())) {
      return nullptr;
    }
    return cert;
  };

  auto add_crl = [&](const std::string &name, int this_update_offset_day,
                     NameHash name_hash) -> bool {
    bssl::UniquePtr<X509_CRL> crl = MakeTestCRL(
        name.c_str(), this_update_offset_day, /*next_update_offset_day=*/1);
    return crl != nullptr &&
           X509_CRL_sign(crl.get(), key.get(), EVP_sha256()) &&
           dir.AddCRL(crl.get(), name_hash);
  };

  // These two CAs collide under |X509_NAME_hash|.
  std::string ca1 = "Test CA 1191514847";
  std::string ca2 = "Test CA 1570301806";
  ASSERT_TRUE(add_root(ca1, kNewHash));
  ASSERT_TRUE(add_root(ca2, kNewHash));
  ASSERT_TRUE(add_crl(ca1, -2, kNewHash));
  ASSERT_TRUE(add_crl(ca2, -1, kNewHash));
  ASSERT_TRUE(add_crl(ca2, -2, kNewHash));
  ASSERT_TRUE(add_crl(ca1, -1, kNewHash));
  // Verify the hashes collided.
  ASSERT_EQ(dir.num_cert_hashes(), 1u);
  ASSERT_EQ(dir.num_crl_hashes(), 1u);
  bssl::UniquePtr<X509> leaf1 = issue_cert(ca1);
  ASSERT_TRUE(leaf1);
  bssl::UniquePtr<X509> leaf2 = issue_cert(ca2);
  ASSERT_TRUE(leaf2);

  // These two CAs collide under |X509_NAME_hash_old|.
  std::string old_ca1 = "Test CA 1069881739";
  std::string old_ca2 = "Test CA 940754110";
  ASSERT_TRUE(add_root(old_ca1, kOldHash));
  ASSERT_TRUE(add_root(old_ca2, kOldHash));
  ASSERT_TRUE(add_crl(old_ca1, -2, kOldHash));
  ASSERT_TRUE(add_crl(old_ca2, -1, kOldHash));
  ASSERT_TRUE(add_crl(old_ca2, -2, kOldHash));
  ASSERT_TRUE(add_crl(old_ca1, -1, kOldHash));
  // Verify the hashes collided.
  ASSERT_EQ(dir.num_cert_hashes(), 2u);
  ASSERT_EQ(dir.num_crl_hashes(), 2u);
  bssl::UniquePtr<X509> old_leaf1 = issue_cert(old_ca1);
  ASSERT_TRUE(old_leaf1);
  bssl::UniquePtr<X509> old_leaf2 = issue_cert(old_ca2);
  ASSERT_TRUE(old_leaf2);

  // Make an |X509_STORE| that gets CAs from |dir|.
  bssl::UniquePtr<X509_STORE> store(X509_STORE_new());
  ASSERT_TRUE(store);
  ASSERT_TRUE(X509_STORE_load_locations(store.get(), /*file=*/nullptr,
                                        dir.path().c_str()));

  auto verify = [&](X509 *cert, bool crl_check) {
    bssl::UniquePtr<X509_STORE_CTX> ctx(X509_STORE_CTX_new());
    ASSERT_TRUE(ctx);
    ASSERT_TRUE(X509_STORE_CTX_init(ctx.get(), store.get(), cert,
                                    /*chain=*/nullptr));
    X509_STORE_CTX_set_flags(ctx.get(), crl_check ? X509_V_FLAG_CRL_CHECK : 0);
    X509_STORE_CTX_set_time_posix(ctx.get(), /*flags=*/0, kReferenceTime);
    EXPECT_TRUE(X509_verify_cert(ctx.get()))
        << X509_verify_cert_error_string(X509_STORE_CTX_get_error(ctx.get()));
  };

  const size_t kNumThreads = 10;
  std::vector<std::thread> threads;
  for (size_t i = 0; i < kNumThreads; i++) {
    threads.emplace_back([&] { verify(leaf1.get(), false); });
    threads.emplace_back([&] { verify(leaf1.get(), true); });
    threads.emplace_back([&] { verify(leaf2.get(), false); });
    threads.emplace_back([&] { verify(leaf2.get(), true); });

    threads.emplace_back([&] { verify(old_leaf1.get(), false); });
    threads.emplace_back([&] { verify(old_leaf1.get(), true); });
    threads.emplace_back([&] { verify(old_leaf2.get(), false); });
    threads.emplace_back([&] { verify(old_leaf2.get(), true); });
  }
  for (auto &thread : threads) {
    thread.join();
  }
}